

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Payload *v)

{
  bool bVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream aoStack_190 [376];
  Payload *local_18;
  Payload *v_local;
  
  local_18 = (Payload *)this;
  v_local = (Payload *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = Payload::is_none(local_18);
  if (bVar1) {
    ::std::operator<<(aoStack_190,"None");
  }
  else {
    ::std::operator<<(aoStack_190,&local_18->asset_path);
    bVar1 = Path::is_valid(&local_18->prim_path);
    if (bVar1) {
      ::std::operator<<(aoStack_190,&local_18->prim_path);
    }
    ::std::operator<<(aoStack_190,&local_18->layerOffset);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Payload &v) {
  std::stringstream ss;

  if (v.is_none()) {
    // pxrUSD serialize and prints 'None' for payload by filling all members in Payload empty.
    ss << "None";

  } else {
    ss << v.asset_path;
    if (v.prim_path.is_valid()) {
      ss << v.prim_path;
    }

    ss << v.layerOffset;
  }

  return ss.str();
}